

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

RuleInfo * __thiscall
anon_unknown.dwarf_4f7cf6::BuildEngineImpl::getRuleInfoForKey(BuildEngineImpl *this,KeyID keyID)

{
  size_type __bkt;
  BuildEngineDelegate *pBVar1;
  __node_ptr p_Var2;
  RuleInfo *pRVar3;
  __hash_code __code;
  __uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_50;
  long *local_48 [2];
  long local_38 [2];
  
  __bkt = (this->ruleInfos)._M_h._M_bucket_count;
  p_Var2 = std::
           _Hashtable<llbuild::core::KeyID,_std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::KeyID>,_std::hash<llbuild::core::KeyID>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<llbuild::core::KeyID,_std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::KeyID>,_std::hash<llbuild::core::KeyID>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(this->ruleInfos)._M_h._M_buckets,__bkt,
                          (key_type *)(keyID._value % __bkt),keyID._value);
  if (p_Var2 == (__node_ptr)0x0) {
    pBVar1 = this->delegate;
    (*(this->super_BuildDBDelegate)._vptr_BuildDBDelegate[3])(local_48,this,keyID._value);
    (*pBVar1->_vptr_BuildEngineDelegate[3])(&local_50,pBVar1,local_48);
    pRVar3 = addRule(this,keyID,
                     (unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *)
                     &local_50);
    if ((_Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>)
        local_50._M_t.
        super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
        super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl != (Rule *)0x0) {
      (**(code **)(*(long *)local_50._M_t.
                            super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                            .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl + 8))
                ();
    }
    local_50._M_t.
    super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
    super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl =
         (tuple<llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>)
         (_Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>)0x0;
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  else {
    pRVar3 = (RuleInfo *)
             ((long)&(p_Var2->
                     super__Hash_node_value<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>
                     ._M_storage._M_storage + 8);
  }
  return pRVar3;
}

Assistant:

RuleInfo& getRuleInfoForKey(KeyID keyID) {
    // Check if we have already found the rule.
    auto it = ruleInfos.find(keyID);
    if (it != ruleInfos.end())
      return it->second;

    // Otherwise, we need to resolve the full key so we can request it from the
    // delegate.
    return addRule(keyID, delegate.lookupRule(getKeyForID(keyID)));
  }